

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

bool __thiscall CBlockPolicyEstimator::Read(CBlockPolicyEstimator *this,AutoFile *filein)

{
  vector<double,_std::allocator<double>_> *defaultBuckets;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *this_00;
  string_view source_file;
  TxConfirmStats *pTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  Logger *pLVar7;
  TxConfirmStats *pTVar8;
  pointer pdVar9;
  mapped_type_conflict *pmVar10;
  runtime_error *prVar11;
  size_t in_RCX;
  int nFileVersion;
  int nFileVersion_00;
  int nFileVersion_01;
  vector<double,_std::allocator<double>_> *v;
  ulong uVar12;
  int *in_R8;
  size_t numBuckets;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nVersionRequired;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  uint32_t obj;
  string log_msg;
  int local_f0 [2];
  unique_lock<std::mutex> local_e8 [3];
  TxConfirmStats *local_b8 [4];
  TxConfirmStats *local_98 [4];
  undefined1 local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8[0]._M_device = &(this->m_cs_fee_estimator).super_mutex;
  local_e8[0]._M_owns = false;
  std::unique_lock<std::mutex>::lock(local_e8);
  AutoFile::read(filein,(int)local_78,(void *)0x4,in_RCX);
  local_f0[0] = local_78._0_4_;
  AutoFile::read(filein,(int)local_78,(void *)0x4,in_RCX);
  if (0x46c6c < local_f0[0]) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<int>(&local_58,"up-version (%d) fee estimate file",local_f0);
    std::runtime_error::runtime_error(prVar11,(string *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00983cf9;
  }
  AutoFile::read(filein,(int)local_78,(void *)0x4,in_RCX);
  if (local_f0[0] < 0x2498c) {
    pLVar7 = LogInstance();
    bVar6 = BCLog::Logger::Enabled(pLVar7);
    if (bVar6) {
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity =
           local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<char[5],int>
                ((string *)local_78,
                 (tinyformat *)"%s: incompatible old fee estimation data (non-fatal). Version: %d\n"
                 ,"Read",(char (*) [5])local_f0,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      if ((TxConfirmStats *)local_78._0_8_ != (TxConfirmStats *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      pLVar7 = LogInstance();
      local_78._0_8_ = &DAT_00000058;
      local_78._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function._M_str = "Read";
      logging_function._M_len = 4;
      BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0x3e9,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        uVar12 = local_58.field_2._M_allocated_capacity + 1;
LAB_0098373b:
        operator_delete(local_58._M_dataplus._M_p,uVar12);
      }
    }
  }
  else {
    uVar2 = local_78._0_4_;
    AutoFile::read(filein,(int)local_78,(void *)0x4,in_RCX);
    uVar3 = local_78._0_4_;
    AutoFile::read(filein,(int)local_78,(void *)0x4,in_RCX);
    uVar4 = local_78._0_4_;
    if (((uint)local_78._0_4_ < (uint)uVar3) || ((uint)uVar2 < (uint)local_78._0_4_)) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar11,"Corrupt estimates file. Historical block range for estimates is invalid");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00983cf9;
    }
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
    Unser<AutoFile,std::vector<double,std::allocator<double>>>
              ((VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *)filein,
               (AutoFile *)&local_58,v);
    numBuckets = (long)(local_58._M_string_length - (long)local_58._M_dataplus._M_p) >> 3;
    if (numBuckets - 0x3e9 < 0xfffffffffffffc19) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar11,"Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00983cf9;
    }
    pTVar8 = (TxConfirmStats *)operator_new(0xb0);
    defaultBuckets = &this->buckets;
    this_00 = &this->bucketMap;
    TxConfirmStats::TxConfirmStats(pTVar8,defaultBuckets,this_00,0x18,0.9952,2);
    local_78._0_8_ = pTVar8;
    pTVar8 = (TxConfirmStats *)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats(pTVar8,defaultBuckets,this_00,0xc,0.962,1);
    local_98[0] = pTVar8;
    pTVar8 = (TxConfirmStats *)operator_new(0xb0);
    TxConfirmStats::TxConfirmStats(pTVar8,defaultBuckets,this_00,0x2a,0.99931,0x18);
    local_b8[0] = pTVar8;
    TxConfirmStats::Read((TxConfirmStats *)local_78._0_8_,filein,nFileVersion,numBuckets);
    TxConfirmStats::Read(local_98[0],filein,nFileVersion_00,numBuckets);
    TxConfirmStats::Read(local_b8[0],filein,nFileVersion_01,numBuckets);
    std::vector<double,_std::allocator<double>_>::operator=
              (defaultBuckets,(vector<double,_std::allocator<double>_> *)&local_58);
    std::
    _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
    ::clear(&this_00->_M_t);
    pdVar9 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar9) {
      uVar12 = 0;
      do {
        pmVar10 = std::
                  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                  ::operator[](this_00,pdVar9 + uVar12);
        *pmVar10 = (mapped_type_conflict)uVar12;
        uVar12 = (ulong)((mapped_type_conflict)uVar12 + 1);
        pdVar9 = (this->buckets).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar12 < (ulong)((long)(this->buckets).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar9 >> 3));
    }
    uVar5 = local_78._0_8_;
    local_78._0_8_ = (TxConfirmStats *)0x0;
    pTVar8 = (this->feeStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->feeStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = (TxConfirmStats *)uVar5;
    if (pTVar8 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->feeStats,pTVar8);
    }
    pTVar1 = local_98[0];
    local_98[0] = (TxConfirmStats *)0x0;
    pTVar8 = (this->shortStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->shortStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = pTVar1;
    if (pTVar8 != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->shortStats,pTVar8);
    }
    pTVar1 = local_b8[0];
    local_b8[0] = (TxConfirmStats *)0x0;
    pTVar8 = (this->longStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
    (this->longStats)._M_t.
    super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
    super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
    super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl = pTVar1;
    if (pTVar8 == (TxConfirmStats *)0x0) {
      this->nBestSeenHeight = uVar2;
      this->historicalFirst = uVar3;
      this->historicalBest = uVar4;
    }
    else {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)&this->longStats,pTVar8);
      this->nBestSeenHeight = uVar2;
      this->historicalFirst = uVar3;
      this->historicalBest = uVar4;
      if (local_b8[0] != (TxConfirmStats *)0x0) {
        std::default_delete<TxConfirmStats>::operator()
                  ((default_delete<TxConfirmStats> *)local_b8,local_b8[0]);
      }
    }
    if (local_98[0] != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)local_98,local_98[0]);
    }
    if ((TxConfirmStats *)local_78._0_8_ != (TxConfirmStats *)0x0) {
      std::default_delete<TxConfirmStats>::operator()
                ((default_delete<TxConfirmStats> *)local_78,(TxConfirmStats *)local_78._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar12 = local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p;
      goto LAB_0098373b;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
LAB_00983cf9:
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Read(AutoFile& filein)
{
    try {
        LOCK(m_cs_fee_estimator);
        int nVersionRequired, nVersionThatWrote;
        filein >> nVersionRequired >> nVersionThatWrote;
        if (nVersionRequired > CLIENT_VERSION) {
            throw std::runtime_error(strprintf("up-version (%d) fee estimate file", nVersionRequired));
        }

        // Read fee estimates file into temporary variables so existing data
        // structures aren't corrupted if there is an exception.
        unsigned int nFileBestSeenHeight;
        filein >> nFileBestSeenHeight;

        if (nVersionRequired < 149900) {
            LogPrintf("%s: incompatible old fee estimation data (non-fatal). Version: %d\n", __func__, nVersionRequired);
        } else { // New format introduced in 149900
            unsigned int nFileHistoricalFirst, nFileHistoricalBest;
            filein >> nFileHistoricalFirst >> nFileHistoricalBest;
            if (nFileHistoricalFirst > nFileHistoricalBest || nFileHistoricalBest > nFileBestSeenHeight) {
                throw std::runtime_error("Corrupt estimates file. Historical block range for estimates is invalid");
            }
            std::vector<double> fileBuckets;
            filein >> Using<VectorFormatter<EncodedDoubleFormatter>>(fileBuckets);
            size_t numBuckets = fileBuckets.size();
            if (numBuckets <= 1 || numBuckets > 1000) {
                throw std::runtime_error("Corrupt estimates file. Must have between 2 and 1000 feerate buckets");
            }

            std::unique_ptr<TxConfirmStats> fileFeeStats(new TxConfirmStats(buckets, bucketMap, MED_BLOCK_PERIODS, MED_DECAY, MED_SCALE));
            std::unique_ptr<TxConfirmStats> fileShortStats(new TxConfirmStats(buckets, bucketMap, SHORT_BLOCK_PERIODS, SHORT_DECAY, SHORT_SCALE));
            std::unique_ptr<TxConfirmStats> fileLongStats(new TxConfirmStats(buckets, bucketMap, LONG_BLOCK_PERIODS, LONG_DECAY, LONG_SCALE));
            fileFeeStats->Read(filein, nVersionThatWrote, numBuckets);
            fileShortStats->Read(filein, nVersionThatWrote, numBuckets);
            fileLongStats->Read(filein, nVersionThatWrote, numBuckets);

            // Fee estimates file parsed correctly
            // Copy buckets from file and refresh our bucketmap
            buckets = fileBuckets;
            bucketMap.clear();
            for (unsigned int i = 0; i < buckets.size(); i++) {
                bucketMap[buckets[i]] = i;
            }

            // Destroy old TxConfirmStats and point to new ones that already reference buckets and bucketMap
            feeStats = std::move(fileFeeStats);
            shortStats = std::move(fileShortStats);
            longStats = std::move(fileLongStats);

            nBestSeenHeight = nFileBestSeenHeight;
            historicalFirst = nFileHistoricalFirst;
            historicalBest = nFileHistoricalBest;
        }
    }
    catch (const std::exception& e) {
        LogPrintf("CBlockPolicyEstimator::Read(): unable to read policy estimator data (non-fatal): %s\n",e.what());
        return false;
    }
    return true;
}